

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

void __thiscall ON_FontList::Internal_UpdateSortedLists(ON_FontList *this)

{
  undefined8 uVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  size_t new_capacity;
  ulong uVar5;
  undefined1 auVar6 [16];
  ON_Font *font;
  ON_wString en;
  ON_Font *local_d0 [5];
  ON_SimpleArray<const_ON_Font_*> *local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  undefined8 local_88;
  ulong local_80;
  ON_SimpleArray<const_ON_Font_*> *local_78;
  long lStack_70;
  ON_SimpleArray<const_ON_Font_*> *local_68;
  long lStack_60;
  ON_SimpleArray<const_ON_Font_*> *local_58;
  ON_SimpleArray<const_ON_Font_*> *local_50;
  ON_SimpleArray<const_ON_Font_*> *local_48;
  ON_FontListImpl *local_40;
  
  local_90 = (long)(this->m_unsorted).m_count;
  if (0 < local_90) {
    local_40 = this->m_sorted;
    auVar6._8_4_ = (int)local_40;
    auVar6._0_8_ = local_40;
    auVar6._12_4_ = (int)((ulong)local_40 >> 0x20);
    local_68 = &local_40->m_by_family_name;
    lStack_60 = auVar6._8_8_ + 0x60;
    local_78 = &local_40->m_by_postscript_name;
    lStack_70 = auVar6._8_8_ + 0x30;
    local_58 = &local_40->m_by_english_windows_logfont_name;
    local_50 = &local_40->m_by_english_family_name;
    local_48 = &local_40->m_by_quartet_name;
    local_98 = -local_90;
    uVar5 = 0;
    do {
      local_a8 = (&local_78)[uVar5];
      new_capacity = local_a8->m_count + local_90;
      if ((uint)local_a8->m_capacity < (uint)new_capacity) {
        ON_SimpleArray<const_ON_Font_*>::SetCapacity(local_a8,new_capacity);
      }
      local_80 = uVar5 & 0xffffffff;
      lVar4 = 0;
      local_a0 = uVar5;
      uVar1 = 0;
      do {
        while( true ) {
          local_88 = uVar1;
          lVar3 = lVar4 + 1;
          local_d0[0] = (this->m_unsorted).m_a[lVar4];
          lVar4 = lVar3;
          if (local_d0[0] != (ON_Font *)0x0) break;
          uVar1 = local_88;
          if (local_98 + lVar3 == 0) {
            if ((char)local_88 == '\0') goto LAB_0047bd2b;
            goto LAB_0047bd11;
          }
        }
        if ((uint)local_a0 < 8) {
          (*(code *)(&DAT_006af1d4 + *(int *)(&DAT_006af1d4 + local_80 * 4)))();
          return;
        }
        pcVar2 = 
        "When you add an array to ON_FontListImpl, you must add a corresponding if clause here.";
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                   ,0xfb9,"",
                   "When you add an array to ON_FontListImpl, you must add a corresponding if clause here."
                  );
        ON_SimpleArray<const_ON_Font_*>::Append(local_a8,local_d0);
        uVar1 = CONCAT71((int7)((ulong)pcVar2 >> 8),1);
      } while (local_98 + lVar3 != 0);
LAB_0047bd11:
      ON_SimpleArray<const_ON_Font_*>::QuickSort
                (local_a8,(_func_int_ON_Font_ptr_ptr_ON_Font_ptr_ptr *)
                          (&PTR_Internal_ComparePostScriptNameEtc_0080f7a0)[local_a0]);
LAB_0047bd2b:
      uVar5 = local_a0 + 1;
    } while (uVar5 != 8);
    if (-1 < (this->m_unsorted).m_capacity) {
      (this->m_unsorted).m_count = 0;
    }
  }
  return;
}

Assistant:

const ON__UINT8* ON_PANOSE1::TenBytes() const
{
  return (const ON__UINT8*)(&m_family_kind);
}